

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

void __thiscall HTTPReplySender::thread_main(HTTPReplySender *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *in_RDX;
  HTTPReplySender *in_RDI;
  int in_R8D;
  char *unaff_retaddr;
  int in_stack_0000000c;
  http_reply_err err;
  undefined1 local_18 [24];
  
  sVar1 = send(in_RDI,(int)local_18,in_RDX,in_RCX,in_R8D);
  if ((int)sVar1 == 0) {
    post_done_event((HTTPReplySender *)err._0_8_,in_stack_0000000c,unaff_retaddr);
  }
  else {
    post_done_event((HTTPReplySender *)err._0_8_,in_stack_0000000c,unaff_retaddr);
  }
  return;
}

Assistant:

void thread_main()
    {
        /* send the reply */
        http_reply_err err;
        if (send(&err))
        {
            /* post the successful 'finished' event */
            post_done_event(0, 0);
        }
        else
        {
            /* post the error */
            post_done_event(err.sock_err, err.msg);
        }
    }